

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int nsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  int local_20;
  int local_1c;
  int i;
  int nr_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->nsTab == (xmlChar **)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    local_1c = nr;
    if (ctxt->nsNr < nr) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Pbm popping %d NS\n",(ulong)(uint)nr);
      local_1c = ctxt->nsNr;
    }
    if (ctxt->nsNr < 1) {
      ctxt_local._4_4_ = 0;
    }
    else {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        ctxt->nsNr = ctxt->nsNr + -1;
        ctxt->nsTab[ctxt->nsNr] = (xmlChar *)0x0;
      }
      ctxt_local._4_4_ = local_1c;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
nsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    if (ctxt->nsTab == NULL) return(0);
    if (ctxt->nsNr < nr) {
        xmlGenericError(xmlGenericErrorContext, "Pbm popping %d NS\n", nr);
        nr = ctxt->nsNr;
    }
    if (ctxt->nsNr <= 0)
        return (0);

    for (i = 0;i < nr;i++) {
         ctxt->nsNr--;
	 ctxt->nsTab[ctxt->nsNr] = NULL;
    }
    return(nr);
}